

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anmparse.c
# Opt level: O3

int yysyntax_error(long *yymsg_alloc,char **yymsg,yypcontext_t *yyctx)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  int in_ECX;
  int iVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  char *__s;
  char *yyp;
  int yyi;
  int iVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  yysymbol_kind_t yyarg [5];
  uint local_58 [6];
  ulong local_40;
  long *local_38;
  
  uVar10 = 0;
  __s = "syntax error";
  if (in_ECX != -2) {
    iVar7 = (int)yypact[*(byte *)&yyctx->yyssp];
    if (iVar7 != -0x21) {
      iVar4 = -iVar7;
      iVar2 = 0;
      if (-1 < yypact[*(byte *)&yyctx->yyssp]) {
        iVar4 = 0;
      }
      iVar8 = 0x2e;
      if (0xbb - iVar7 < 0x2e) {
        iVar8 = 0xbb - iVar7;
      }
      if (iVar4 < iVar8) {
        lVar5 = (long)iVar4;
        __s = "syntax error, unexpected %s";
        do {
          if ((lVar5 != 1) &&
             ((uint)lVar5 ==
              (uint)"\x16!\n\x10\x17\x18\x19\x1a\x1b\x05\x17\x18\x19\x1a\x1b\x17\x18\x19\x1a\x1b\b\x10\n\x03\x04\x05\x06"
                    [iVar7 + lVar5])) {
            if (iVar2 == 4) {
              uVar10 = 1;
              goto switchD_0010b320_caseD_fffffffe;
            }
            lVar9 = (long)iVar2;
            iVar2 = iVar2 + 1;
            local_58[lVar9 + 1] =
                 (uint)"\x16!\n\x10\x17\x18\x19\x1a\x1b\x05\x17\x18\x19\x1a\x1b\x17\x18\x19\x1a\x1b\b\x10\n\x03\x04\x05\x06"
                       [iVar7 + lVar5];
          }
          lVar5 = lVar5 + 1;
        } while (iVar8 != lVar5);
        if (iVar2 == -2) {
          return -2;
        }
        if (iVar2 != 0) {
          uVar10 = (ulong)(iVar2 + 1);
          __s = "syntax error";
          switch(iVar2) {
          case 1:
            __s = "syntax error, unexpected %s, expecting %s";
            uVar10 = 2;
            break;
          case 2:
            __s = "syntax error, unexpected %s, expecting %s or %s";
            uVar10 = 3;
            break;
          case 3:
            __s = "syntax error, unexpected %s, expecting %s or %s or %s";
            uVar10 = 4;
            break;
          case 4:
            __s = "syntax error, unexpected %s, expecting %s or %s or %s or %s";
            uVar10 = 5;
            break;
          case -3:
            return -2;
          }
          goto switchD_0010b320_caseD_fffffffe;
        }
      }
    }
    local_58[1] = 0xfffffffe;
    uVar10 = 1;
    __s = "syntax error, unexpected %s";
  }
switchD_0010b320_caseD_fffffffe:
  local_38 = yymsg_alloc;
  sVar3 = strlen(__s);
  lVar5 = (sVar3 - (long)((int)uVar10 * 2)) + 1;
  local_40 = uVar10;
  if (0 < (int)uVar10) {
    uVar11 = 0;
    do {
      lVar9 = yytnamerr((char *)0x0,yytname[(int)local_58[uVar11]]);
      if (lVar9 < 0) {
        return -2;
      }
      lVar5 = lVar5 + lVar9;
      uVar11 = uVar11 + 1;
    } while (uVar10 != uVar11);
  }
  uVar10 = local_40;
  if (lVar5 <= *local_38) {
    iVar7 = 0;
    do {
      cVar1 = *__s;
      *(char *)yymsg = cVar1;
      lVar5 = 1;
      if (cVar1 == '%') {
        if ((__s[1] == 's') && (iVar7 < (int)uVar10)) {
          lVar5 = (long)iVar7;
          iVar7 = iVar7 + 1;
          lVar5 = yytnamerr((char *)yymsg,yytname[(int)local_58[lVar5]]);
          lVar9 = 2;
        }
        else {
          lVar9 = 1;
        }
      }
      else {
        lVar9 = 1;
        if (cVar1 == '\0') {
          return 0;
        }
      }
      yymsg = (char **)((long)yymsg + lVar5);
      __s = __s + lVar9;
    } while( true );
  }
  lVar9 = lVar5 * 2;
  lVar6 = 0x7fffffffffffffff;
  if (lVar5 == lVar9 || SBORROW8(lVar5,lVar9) != 0 < lVar5) {
    lVar6 = lVar9;
  }
  *local_38 = lVar6;
  return -1;
}

Assistant:

static int
yysyntax_error (YYPTRDIFF_T *yymsg_alloc, char **yymsg,
                const yypcontext_t *yyctx)
{
  enum { YYARGS_MAX = 5 };
  /* Internationalized format string. */
  const char *yyformat = YY_NULLPTR;
  /* Arguments of yyformat: reported tokens (one for the "unexpected",
     one per "expected"). */
  yysymbol_kind_t yyarg[YYARGS_MAX];
  /* Cumulated lengths of YYARG.  */
  YYPTRDIFF_T yysize = 0;

  /* Actual size of YYARG. */
  int yycount = yy_syntax_error_arguments (yyctx, yyarg, YYARGS_MAX);
  if (yycount == YYENOMEM)
    return YYENOMEM;

  switch (yycount)
    {
#define YYCASE_(N, S)                       \
      case N:                               \
        yyformat = S;                       \
        break
    default: /* Avoid compiler warnings. */
      YYCASE_(0, YY_("syntax error"));
      YYCASE_(1, YY_("syntax error, unexpected %s"));
      YYCASE_(2, YY_("syntax error, unexpected %s, expecting %s"));
      YYCASE_(3, YY_("syntax error, unexpected %s, expecting %s or %s"));
      YYCASE_(4, YY_("syntax error, unexpected %s, expecting %s or %s or %s"));
      YYCASE_(5, YY_("syntax error, unexpected %s, expecting %s or %s or %s or %s"));
#undef YYCASE_
    }

  /* Compute error message size.  Don't count the "%s"s, but reserve
     room for the terminator.  */
  yysize = yystrlen (yyformat) - 2 * yycount + 1;
  {
    int yyi;
    for (yyi = 0; yyi < yycount; ++yyi)
      {
        YYPTRDIFF_T yysize1
          = yysize + yytnamerr (YY_NULLPTR, yytname[yyarg[yyi]]);
        if (yysize <= yysize1 && yysize1 <= YYSTACK_ALLOC_MAXIMUM)
          yysize = yysize1;
        else
          return YYENOMEM;
      }
  }

  if (*yymsg_alloc < yysize)
    {
      *yymsg_alloc = 2 * yysize;
      if (! (yysize <= *yymsg_alloc
             && *yymsg_alloc <= YYSTACK_ALLOC_MAXIMUM))
        *yymsg_alloc = YYSTACK_ALLOC_MAXIMUM;
      return -1;
    }

  /* Avoid sprintf, as that infringes on the user's name space.
     Don't have undefined behavior even if the translation
     produced a string with the wrong number of "%s"s.  */
  {
    char *yyp = *yymsg;
    int yyi = 0;
    while ((*yyp = *yyformat) != '\0')
      if (*yyp == '%' && yyformat[1] == 's' && yyi < yycount)
        {
          yyp += yytnamerr (yyp, yytname[yyarg[yyi++]]);
          yyformat += 2;
        }
      else
        {
          ++yyp;
          ++yyformat;
        }
  }
  return 0;
}